

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O0

bool double_conversion::DigitGenCounted
               (DiyFp w,int requested_digits,Vector<char> buffer,int *length,int *kappa)

{
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  uint32_t number;
  int32_t iVar1;
  int32_t exponent;
  uint uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  char *pcVar5;
  ulong uVar6;
  int *kappa_00;
  int in_EDX;
  int *in_R9;
  int *in_stack_00000008;
  int digit_1;
  uint64_t rest;
  int digit;
  int divisor_exponent_plus_one;
  uint32_t divisor;
  uint64_t fractionals;
  uint32_t integrals;
  DiyFp one;
  uint64_t w_error;
  uint64_t in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  int iVar7;
  uint64_t in_stack_ffffffffffffff00;
  ulong in_stack_ffffffffffffff08;
  int iVar8;
  undefined6 in_stack_ffffffffffffff10;
  char in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  undefined1 uVar9;
  undefined8 in_stack_ffffffffffffff18;
  int *in_stack_ffffffffffffff30;
  int local_68;
  uint local_64;
  ulong local_60;
  uint32_t local_54;
  DiyFp local_50;
  ulong local_40;
  int *local_38;
  int local_2c;
  Vector<char> local_28;
  DiyFp local_18;
  bool local_1;
  
  local_40 = 1;
  local_38 = in_R9;
  local_2c = in_EDX;
  iVar1 = DiyFp::e(&local_18);
  exponent = DiyFp::e(&local_18);
  DiyFp::DiyFp(&local_50,1L << (-(char)iVar1 & 0x3fU),exponent);
  uVar3 = DiyFp::f(&local_18);
  iVar1 = DiyFp::e(&local_50);
  local_54 = (uint32_t)(uVar3 >> (-(char)iVar1 & 0x3fU));
  uVar3 = DiyFp::f(&local_18);
  uVar4 = DiyFp::f(&local_50);
  number = local_54;
  local_60 = uVar3 & uVar4 - 1;
  iVar1 = DiyFp::e(&local_50);
  BiggestPowerTen(number,iVar1 + 0x40,&local_64,&local_68);
  *in_stack_00000008 = local_68;
  *local_38 = 0;
  while (0 < *in_stack_00000008) {
    uVar2 = local_54 / local_64;
    pcVar5 = Vector<char>::operator[](&local_28,*local_38);
    *pcVar5 = (char)uVar2 + '0';
    *local_38 = *local_38 + 1;
    local_2c = local_2c + -1;
    local_54 = local_54 % local_64;
    *in_stack_00000008 = *in_stack_00000008 + -1;
    if (local_2c == 0) break;
    local_64 = local_64 / 10;
  }
  iVar8 = (int)(in_stack_ffffffffffffff08 >> 0x20);
  if (local_2c == 0) {
    uVar6 = (ulong)local_54;
    iVar1 = DiyFp::e(&local_50);
    kappa_00 = (int *)((uVar6 << (-(char)iVar1 & 0x3fU)) + local_60);
    DiyFp::e(&local_50);
    buffer_00.start_._6_1_ = in_stack_ffffffffffffff16;
    buffer_00.start_._0_6_ = in_stack_ffffffffffffff10;
    buffer_00.start_._7_1_ = in_stack_ffffffffffffff17;
    buffer_00._8_8_ = uVar6;
    local_1 = RoundWeedCounted(buffer_00,iVar8,in_stack_ffffffffffffff00,
                               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                               in_stack_fffffffffffffef0,kappa_00);
  }
  else {
    while( true ) {
      iVar8 = (int)(in_stack_ffffffffffffff08 >> 0x20);
      uVar9 = 0 < local_2c && local_40 < local_60;
      if (0 >= local_2c || local_40 >= local_60) break;
      in_stack_ffffffffffffff08 = local_60 * 10;
      local_40 = local_40 * 10;
      local_60 = in_stack_ffffffffffffff08;
      iVar1 = DiyFp::e(&local_50);
      in_stack_ffffffffffffff16 = (char)(in_stack_ffffffffffffff08 >> (-(char)iVar1 & 0x3fU)) + '0';
      pcVar5 = Vector<char>::operator[](&local_28,*local_38);
      *pcVar5 = in_stack_ffffffffffffff16;
      *local_38 = *local_38 + 1;
      local_2c = local_2c + -1;
      uVar3 = DiyFp::f(&local_50);
      local_60 = uVar3 - 1 & local_60;
      *in_stack_00000008 = *in_stack_00000008 + -1;
    }
    if (local_2c == 0) {
      iVar7 = *local_38;
      uVar6 = local_60;
      DiyFp::f(&local_50);
      buffer_01.start_._6_1_ = in_stack_ffffffffffffff16;
      buffer_01.start_._0_6_ = in_stack_ffffffffffffff10;
      buffer_01.start_._7_1_ = uVar9;
      buffer_01._8_8_ = in_stack_ffffffffffffff18;
      local_1 = RoundWeedCounted(buffer_01,iVar8,uVar6,CONCAT44(iVar7,in_stack_fffffffffffffef8),
                                 in_stack_fffffffffffffef0,in_stack_ffffffffffffff30);
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool DigitGenCounted(DiyFp w,
                            int requested_digits,
                            Vector<char> buffer,
                            int* length,
                            int* kappa) {
  DOUBLE_CONVERSION_ASSERT(kMinimalTargetExponent <= w.e() && w.e() <= kMaximalTargetExponent);
  DOUBLE_CONVERSION_ASSERT(kMinimalTargetExponent >= -60);
  DOUBLE_CONVERSION_ASSERT(kMaximalTargetExponent <= -32);
  // w is assumed to have an error less than 1 unit. Whenever w is scaled we
  // also scale its error.
  uint64_t w_error = 1;
  // We cut the input number into two parts: the integral digits and the
  // fractional digits. We don't emit any decimal separator, but adapt kappa
  // instead. Example: instead of writing "1.2" we put "12" into the buffer and
  // increase kappa by 1.
  DiyFp one = DiyFp(static_cast<uint64_t>(1) << -w.e(), w.e());
  // Division by one is a shift.
  uint32_t integrals = static_cast<uint32_t>(w.f() >> -one.e());
  // Modulo by one is an and.
  uint64_t fractionals = w.f() & (one.f() - 1);
  uint32_t divisor;
  int divisor_exponent_plus_one;
  BiggestPowerTen(integrals, DiyFp::kSignificandSize - (-one.e()),
                  &divisor, &divisor_exponent_plus_one);
  *kappa = divisor_exponent_plus_one;
  *length = 0;

  // Loop invariant: buffer = w / 10^kappa  (integer division)
  // The invariant holds for the first iteration: kappa has been initialized
  // with the divisor exponent + 1. And the divisor is the biggest power of ten
  // that is smaller than 'integrals'.
  while (*kappa > 0) {
    int digit = integrals / divisor;
    DOUBLE_CONVERSION_ASSERT(digit <= 9);
    buffer[*length] = static_cast<char>('0' + digit);
    (*length)++;
    requested_digits--;
    integrals %= divisor;
    (*kappa)--;
    // Note that kappa now equals the exponent of the divisor and that the
    // invariant thus holds again.
    if (requested_digits == 0) break;
    divisor /= 10;
  }

  if (requested_digits == 0) {
    uint64_t rest =
        (static_cast<uint64_t>(integrals) << -one.e()) + fractionals;
    return RoundWeedCounted(buffer, *length, rest,
                            static_cast<uint64_t>(divisor) << -one.e(), w_error,
                            kappa);
  }

  // The integrals have been generated. We are at the point of the decimal
  // separator. In the following loop we simply multiply the remaining digits by
  // 10 and divide by one. We just need to pay attention to multiply associated
  // data (the 'unit'), too.
  // Note that the multiplication by 10 does not overflow, because w.e >= -60
  // and thus one.e >= -60.
  DOUBLE_CONVERSION_ASSERT(one.e() >= -60);
  DOUBLE_CONVERSION_ASSERT(fractionals < one.f());
  DOUBLE_CONVERSION_ASSERT(DOUBLE_CONVERSION_UINT64_2PART_C(0xFFFFFFFF, FFFFFFFF) / 10 >= one.f());
  while (requested_digits > 0 && fractionals > w_error) {
    fractionals *= 10;
    w_error *= 10;
    // Integer division by one.
    int digit = static_cast<int>(fractionals >> -one.e());
    DOUBLE_CONVERSION_ASSERT(digit <= 9);
    buffer[*length] = static_cast<char>('0' + digit);
    (*length)++;
    requested_digits--;
    fractionals &= one.f() - 1;  // Modulo by one.
    (*kappa)--;
  }
  if (requested_digits != 0) return false;
  return RoundWeedCounted(buffer, *length, fractionals, one.f(), w_error,
                          kappa);
}